

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_connect_for_tx(tftp_state_data *state,tftp_event_t event)

{
  Curl_easy *data_00;
  Curl_easy *data;
  CURLcode result;
  tftp_event_t event_local;
  tftp_state_data *state_local;
  
  data_00 = state->data;
  if (((data_00 != (Curl_easy *)0x0) && ((*(ulong *)&(data_00->set).field_0x8ca >> 0x1c & 1) != 0))
     && (((data_00->state).feat == (curl_trc_feat *)0x0 || (0 < ((data_00->state).feat)->log_level))
        )) {
    Curl_infof(data_00,"%s","Connected for transmit");
  }
  state->state = TFTP_STATE_TX;
  state_local._4_4_ = tftp_set_timeouts(state);
  if (state_local._4_4_ == CURLE_OK) {
    state_local._4_4_ = tftp_tx(state,event);
  }
  return state_local._4_4_;
}

Assistant:

static CURLcode tftp_connect_for_tx(struct tftp_state_data *state,
                                    tftp_event_t event)
{
  CURLcode result;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  struct Curl_easy *data = state->data;

  infof(data, "%s", "Connected for transmit");
#endif
  state->state = TFTP_STATE_TX;
  result = tftp_set_timeouts(state);
  if(result)
    return result;
  return tftp_tx(state, event);
}